

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

void sync_queries(vw *all,svm_params *params,bool *train_pool)

{
  flat_example *__ptr;
  vw *all_00;
  int iVar1;
  io_buf *model_file;
  unsigned_long *buffer;
  char *buffer_00;
  svm_example *psVar2;
  size_t nmemb;
  ulong uVar3;
  unsigned_long uVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  flat_example *fec;
  flat_example *local_58;
  vw *local_50;
  unsigned_long *local_48;
  v_array<char> *local_40;
  bool *local_38;
  
  local_50 = all;
  model_file = (io_buf *)operator_new(0xa8);
  model_file->_vptr_io_buf = (_func_int **)&PTR_open_file_002d40b8;
  local_40 = &model_file->space;
  (model_file->space)._begin = (char *)0x0;
  (model_file->space)._end = (char *)0x0;
  (model_file->space).end_array = (char *)0x0;
  (model_file->space).erase_count = 0;
  (model_file->files)._begin = (int *)0x0;
  (model_file->files)._end = (int *)0x0;
  (model_file->files).end_array = (int *)0x0;
  (model_file->files).erase_count = 0;
  (model_file->currentname)._begin = (char *)0x0;
  (model_file->currentname)._end = (char *)0x0;
  (model_file->currentname).end_array = (char *)0x0;
  (model_file->currentname).erase_count = 0;
  (model_file->finalname)._begin = (char *)0x0;
  (model_file->finalname)._end = (char *)0x0;
  (model_file->finalname).end_array = (char *)0x0;
  (model_file->finalname).erase_count = 0;
  v_array<char>::resize(local_40,0x10000);
  model_file->count = 0;
  model_file->current = 0;
  model_file->head = (model_file->space)._begin;
  model_file->_verify_hash = false;
  model_file->_hash = 0;
  local_58 = (flat_example *)0x0;
  uVar3 = params->pool_pos;
  if (uVar3 != 0) {
    uVar6 = 0;
    do {
      if (train_pool[uVar6] == true) {
        local_58 = &params->pool[uVar6]->ex;
        save_load_flat_example(model_file,false,&local_58);
        psVar2 = params->pool[uVar6];
        if (psVar2 != (svm_example *)0x0) {
          svm_example::~svm_example(psVar2);
        }
        operator_delete(psVar2);
        uVar3 = params->pool_pos;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar3);
  }
  all_00 = local_50;
  local_38 = train_pool;
  buffer = calloc_or_throw<unsigned_long>(local_50->all_reduce->total);
  buffer[all_00->all_reduce->node] = (long)model_file->head - (long)(model_file->space)._begin;
  all_reduce<unsigned_long,_&add_size_t>(all_00,buffer,all_00->all_reduce->total);
  uVar3 = all_00->all_reduce->total;
  if (uVar3 != 0) {
    uVar6 = 0;
    nmemb = 0;
    pcVar7 = (char *)0x0;
    do {
      uVar4 = 0;
      if (uVar6 <= all_00->all_reduce->node - 1) {
        uVar4 = buffer[uVar6];
      }
      pcVar7 = pcVar7 + uVar4;
      nmemb = nmemb + buffer[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
    if (nmemb != 0) {
      local_48 = buffer;
      buffer_00 = calloc_or_throw<char>(nmemb);
      pcVar5 = (model_file->space)._begin;
      memcpy(buffer_00 + (long)pcVar7,pcVar5,(long)model_file->head - (long)pcVar5);
      pcVar5 = (model_file->space)._begin;
      if (pcVar5 != (char *)0x0) {
        free(pcVar5);
      }
      local_40->_begin = (char *)0x0;
      local_40->_end = (char *)0x0;
      local_40->end_array = (char *)0x0;
      all_reduce<char,_&copy_char>(local_50,buffer_00,nmemb);
      (model_file->space)._begin = buffer_00;
      model_file->head = buffer_00;
      (model_file->space)._end = buffer_00 + nmemb;
      params->pool_pos = 0;
      buffer = local_48;
      if (params->pool_size != 0) {
        uVar3 = 0;
        pcVar5 = (char *)0x0;
        do {
          buffer = local_48;
          iVar1 = save_load_flat_example(model_file,true,&local_58);
          if (iVar1 != 0) break;
          psVar2 = calloc_or_throw<svm_example>(1);
          __ptr = local_58;
          params->pool[uVar3] = psVar2;
          memcpy(&params->pool[uVar3]->ex,local_58,200);
          free(__ptr);
          local_38[uVar3] = true;
          params->pool_pos = params->pool_pos + 1;
          pcVar5 = model_file->head + ((long)pcVar5 - (long)(model_file->space)._begin);
          if (pcVar5 == pcVar7) {
            params->local_begin = uVar3 + 1;
          }
          if (pcVar5 == pcVar7 + local_48[local_50->all_reduce->node]) {
            params->local_end = uVar3;
          }
          uVar3 = uVar3 + 1;
          buffer = local_48;
        } while (uVar3 < params->pool_size);
      }
    }
  }
  if (local_58 != (flat_example *)0x0) {
    free(local_58);
  }
  free(buffer);
  (*model_file->_vptr_io_buf[3])(model_file);
  return;
}

Assistant:

void sync_queries(vw& all, svm_params& params, bool* train_pool)
{
  io_buf* b = new io_buf();

  char* queries;
  flat_example* fec = nullptr;

  for (size_t i = 0; i < params.pool_pos; i++)
  {
    if (!train_pool[i])
      continue;

    fec = &(params.pool[i]->ex);
    save_load_flat_example(*b, false, fec);
    delete params.pool[i];
  }

  size_t* sizes = calloc_or_throw<size_t>(all.all_reduce->total);
  sizes[all.all_reduce->node] = b->head - b->space.begin();
  // params.all->opts_n_args.trace_message<<"Sizes = "<<sizes[all.node]<<" ";
  all_reduce<size_t, add_size_t>(all, sizes, all.all_reduce->total);

  size_t prev_sum = 0, total_sum = 0;
  for (size_t i = 0; i < all.all_reduce->total; i++)
  {
    if (i <= (all.all_reduce->node - 1))
      prev_sum += sizes[i];
    total_sum += sizes[i];
  }

  // params.all->opts_n_args.trace_message<<total_sum<<" "<<prev_sum<<endl;
  if (total_sum > 0)
  {
    queries = calloc_or_throw<char>(total_sum);
    memcpy(queries + prev_sum, b->space.begin(), b->head - b->space.begin());
    b->space.delete_v();
    all_reduce<char, copy_char>(all, queries, total_sum);

    b->space.begin() = queries;
    b->head = b->space.begin();
    b->space.end() = &queries[total_sum * sizeof(char)];

    size_t num_read = 0;
    params.pool_pos = 0;

    for (size_t i = 0; i < params.pool_size; i++)
    {
      if (!save_load_flat_example(*b, true, fec))
      {
        params.pool[i] = &calloc_or_throw<svm_example>();
        params.pool[i]->init_svm_example(fec);
        train_pool[i] = true;
        params.pool_pos++;
        // for(int j = 0;j < fec->feature_map_len;j++)
        //   params.all->opts_n_args.trace_message<<fec->feature_map[j].weight_index<<":"<<fec->feature_map[j].x<<" ";
        // params.all->opts_n_args.trace_message<<endl;
        // params.pool[i]->in_use = true;
        // params.current_t += ((label_data*) params.pool[i]->ld)->weight;
        // params.pool[i]->example_t = params.current_t;
      }
      else
        break;

      num_read += b->head - b->space.begin();
      if (num_read == prev_sum)
        params.local_begin = i + 1;
      if (num_read == prev_sum + sizes[all.all_reduce->node])
        params.local_end = i;
    }
  }
  if (fec)
    free(fec);
  free(sizes);
  delete b;
}